

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialPivLU.h
# Opt level: O0

PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> * __thiscall
Eigen::PartialPivLU<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::compute
          (PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this,MatrixType *matrix)

{
  int iVar1;
  Index IVar2;
  Index IVar3;
  int local_24;
  Index IStack_20;
  Index nb_transpositions;
  Index size;
  MatrixType *matrix_local;
  PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this_local;
  
  size = (Index)matrix;
  matrix_local = &this->m_lu;
  IVar2 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                    (&matrix->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
  iVar1 = GenericNumTraits<int>::highest();
  if (iVar1 <= IVar2) {
    __assert_fail("matrix.rows()<NumTraits<int>::highest()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zonotopes[P]zono_cpp/Eigen/src/LU/PartialPivLU.h"
                  ,0x186,
                  "PartialPivLU<MatrixType> &Eigen::PartialPivLU<Eigen::Matrix<double, -1, -1>>::compute(const MatrixType &) [MatrixType = Eigen::Matrix<double, -1, -1>]"
                 );
  }
  Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=
            (&this->m_lu,(Matrix<double,__1,__1,_0,__1,__1> *)size);
  IVar2 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                    ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)size);
  IVar3 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                    ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)size);
  if (IVar2 != IVar3) {
    __assert_fail("matrix.rows() == matrix.cols() && \"PartialPivLU is only for square (and moreover invertible) matrices\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zonotopes[P]zono_cpp/Eigen/src/LU/PartialPivLU.h"
                  ,0x18a,
                  "PartialPivLU<MatrixType> &Eigen::PartialPivLU<Eigen::Matrix<double, -1, -1>>::compute(const MatrixType &) [MatrixType = Eigen::Matrix<double, -1, -1>]"
                 );
  }
  IStack_20 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                        ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)size);
  TranspositionsBase<Eigen::Transpositions<-1,_-1,_int>_>::resize
            ((TranspositionsBase<Eigen::Transpositions<_1,__1,_int>_> *)&this->m_rowsTranspositions,
             (int)IStack_20);
  internal::partial_lu_inplace<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpositions<_1,_1,int>>
            (&this->m_lu,&this->m_rowsTranspositions,&local_24);
  iVar1 = 1;
  if (local_24 % 2 != 0) {
    iVar1 = -1;
  }
  this->m_det_p = (long)iVar1;
  PermutationMatrix<-1,-1,int>::operator=
            ((PermutationMatrix<_1,_1,int> *)&this->m_p,
             (TranspositionsBase<Eigen::Transpositions<_1,__1,_int>_> *)&this->m_rowsTranspositions)
  ;
  this->m_isInitialized = true;
  return this;
}

Assistant:

PartialPivLU<MatrixType>& PartialPivLU<MatrixType>::compute(const MatrixType& matrix)
{
  // the row permutation is stored as int indices, so just to be sure:
  eigen_assert(matrix.rows()<NumTraits<int>::highest());
  
  m_lu = matrix;

  eigen_assert(matrix.rows() == matrix.cols() && "PartialPivLU is only for square (and moreover invertible) matrices");
  const Index size = matrix.rows();

  m_rowsTranspositions.resize(size);

  typename TranspositionType::Index nb_transpositions;
  internal::partial_lu_inplace(m_lu, m_rowsTranspositions, nb_transpositions);
  m_det_p = (nb_transpositions%2) ? -1 : 1;

  m_p = m_rowsTranspositions;

  m_isInitialized = true;
  return *this;
}